

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_state.hpp
# Opt level: O1

void __thiscall libtorrent::dht::dht_state::~dht_state(dht_state *this)

{
  pointer pbVar1;
  pointer ppVar2;
  
  pbVar1 = (this->nodes6).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 != (pointer)0x0) {
    operator_delete(pbVar1,(long)(this->nodes6).
                                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar1);
  }
  pbVar1 = (this->nodes).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar1 != (pointer)0x0) {
    operator_delete(pbVar1,(long)(this->nodes).
                                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar1);
  }
  ppVar2 = (this->nids).
           super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2,(long)(this->nids).
                                 super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2);
    return;
  }
  return;
}

Assistant:

struct TORRENT_EXPORT dht_state
	{
		node_ids_t nids;

		// the bootstrap nodes saved from the buckets node
		std::vector<udp::endpoint> nodes;
		// the bootstrap nodes saved from the IPv6 buckets node
		std::vector<udp::endpoint> nodes6;

		void clear();
	}